

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

int verifyMerkleTree(tree_t *tree,uint8_t **leafData,uint8_t *salt,picnic_instance_t *params)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  long in_RSI;
  long *in_RDI;
  uint i_1;
  uint i;
  uint firstLeaf;
  picnic_instance_t *in_stack_000000a8;
  uint8_t *in_stack_000000b0;
  uint in_stack_000000bc;
  tree_t *in_stack_000000c0;
  uint in_stack_ffffffffffffffcc;
  uint uVar4;
  int local_4;
  
  iVar2 = (int)in_RDI[3] - *(int *)((long)in_RDI + 0x1c);
  uVar4 = 0;
  do {
    if (*(uint *)((long)in_RDI + 0x1c) <= uVar4) {
      for (iVar3 = (int)in_RDI[3]; iVar3 != 0; iVar3 = iVar3 + -1) {
        computeParentHash(in_stack_000000c0,in_stack_000000bc,in_stack_000000b0,in_stack_000000a8);
      }
      _Var1 = haveNode((tree_t *)CONCAT44(iVar2,uVar4),0);
      if (_Var1) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
      return local_4;
    }
    if (*(long *)(in_RSI + (ulong)uVar4 * 8) != 0) {
      _Var1 = haveNode((tree_t *)CONCAT44(iVar2,uVar4),in_stack_ffffffffffffffcc);
      if (_Var1) {
        return -1;
      }
      memcpy((void *)(*in_RDI + (ulong)((iVar2 + uVar4) * *(int *)((long)in_RDI + 0x14))),
             *(void **)(in_RSI + (ulong)uVar4 * 8),(ulong)*(uint *)((long)in_RDI + 0x14));
      markNode((tree_t *)CONCAT44(iVar2,uVar4),in_stack_ffffffffffffffcc);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int verifyMerkleTree(tree_t* tree, /* uint16_t* missingLeaves, size_t missingLeavesSize, */
                     uint8_t** leafData, uint8_t* salt, const picnic_instance_t* params) {
  unsigned int firstLeaf = tree->numNodes - tree->numLeaves;

  /* Copy the leaf data, where we have it. The actual data being committed to has already been
   * hashed, according to the spec. */
  for (unsigned int i = 0; i < tree->numLeaves; i++) {
    if (leafData[i] != NULL) {
      if (haveNode(tree, firstLeaf + i)) {
        return -1; /* A leaf was assigned from the prover for a node we've recomputed */
      }

      memcpy(&tree->nodes[(firstLeaf + i) * tree->dataSize], leafData[i], tree->dataSize);
      markNode(tree, firstLeaf + i);
    }
  }

  /* At this point the tree has some of the leaves, and some intermediate nodes
   * Work up the tree, computing all nodes we don't have that are missing. */
  for (unsigned int i = tree->numNodes; i > 0; i--) {
    computeParentHash(tree, i, salt, params);
  }

  /* Fail if the root was not computed. */
  if (!haveNode(tree, 0)) {
    return -1;
  }

  return 0;
}